

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSnapObjects.cpp
# Opt level: O2

void TTD::NSSnapObjects::ParseAddtlInfo_SnapPromiseInfo
               (SnapObject *snpObject,FileReader *reader,SlabAllocator *alloc)

{
  uint32 uVar1;
  int iVar2;
  SnapPromiseInfo *addtlInfo;
  TTDVar pvVar3;
  SnapPromiseReactionInfo *pSVar4;
  uint32 i;
  ulong uVar5;
  long lVar6;
  
  addtlInfo = (SnapPromiseInfo *)SlabAllocatorBase<0>::SlabAllocateTypeRawSize<48ul>(alloc);
  uVar1 = FileReader::ReadUInt32(reader,u32Val,true);
  addtlInfo->Status = uVar1;
  iVar2 = (*reader->_vptr_FileReader[10])(reader,10,1);
  addtlInfo->isHandled = SUB41(iVar2,0);
  (*reader->_vptr_FileReader[3])(reader,6,1);
  pvVar3 = NSSnapValues::ParseTTDVar(false,reader);
  addtlInfo->Result = pvVar3;
  uVar1 = FileReader::ReadLengthValue(reader,true);
  addtlInfo->ResolveReactionCount = uVar1;
  addtlInfo->ResolveReactions = (SnapPromiseReactionInfo *)0x0;
  FileReader::ReadSequenceStart_WDefaultKey(reader,true);
  if ((ulong)addtlInfo->ResolveReactionCount != 0) {
    pSVar4 = SlabAllocatorBase<0>::SlabAllocateArray<TTD::NSSnapValues::SnapPromiseReactionInfo>
                       (alloc,(ulong)addtlInfo->ResolveReactionCount);
    addtlInfo->ResolveReactions = pSVar4;
    lVar6 = 0;
    for (uVar5 = 0; uVar5 < addtlInfo->ResolveReactionCount; uVar5 = uVar5 + 1) {
      NSSnapValues::ParsePromiseReactionInfo
                ((SnapPromiseReactionInfo *)
                 ((long)&addtlInfo->ResolveReactions->PromiseReactionId + lVar6),lVar6 != 0,reader,
                 alloc);
      lVar6 = lVar6 + 0x30;
    }
  }
  (*reader->_vptr_FileReader[5])(reader);
  uVar1 = FileReader::ReadLengthValue(reader,true);
  addtlInfo->RejectReactionCount = uVar1;
  addtlInfo->RejectReactions = (SnapPromiseReactionInfo *)0x0;
  FileReader::ReadSequenceStart_WDefaultKey(reader,true);
  if ((ulong)addtlInfo->RejectReactionCount != 0) {
    pSVar4 = SlabAllocatorBase<0>::SlabAllocateArray<TTD::NSSnapValues::SnapPromiseReactionInfo>
                       (alloc,(ulong)addtlInfo->RejectReactionCount);
    addtlInfo->RejectReactions = pSVar4;
    lVar6 = 0;
    for (uVar5 = 0; uVar5 < addtlInfo->RejectReactionCount; uVar5 = uVar5 + 1) {
      NSSnapValues::ParsePromiseReactionInfo
                ((SnapPromiseReactionInfo *)
                 ((long)&addtlInfo->RejectReactions->PromiseReactionId + lVar6),lVar6 != 0,reader,
                 alloc);
      lVar6 = lVar6 + 0x30;
    }
  }
  (*reader->_vptr_FileReader[5])(reader);
  SnapObjectSetAddtlInfoAs<TTD::NSSnapObjects::SnapPromiseInfo*,(TTD::NSSnapObjects::SnapObjectType)28>
            (snpObject,addtlInfo);
  return;
}

Assistant:

void ParseAddtlInfo_SnapPromiseInfo(SnapObject* snpObject, FileReader* reader, SlabAllocator& alloc)
        {
            SnapPromiseInfo* promiseInfo = alloc.SlabAllocateStruct<SnapPromiseInfo>();

            promiseInfo->Status = reader->ReadUInt32(NSTokens::Key::u32Val, true);
            promiseInfo->isHandled = reader->ReadBool(NSTokens::Key::boolVal, true);

            reader->ReadKey(NSTokens::Key::resultValue, true);
            promiseInfo->Result = NSSnapValues::ParseTTDVar(false, reader);

            promiseInfo->ResolveReactionCount = reader->ReadLengthValue(true);
            promiseInfo->ResolveReactions = nullptr;
            reader->ReadSequenceStart_WDefaultKey(true);
            if(promiseInfo->ResolveReactionCount != 0)
            {
                promiseInfo->ResolveReactions = alloc.SlabAllocateArray<NSSnapValues::SnapPromiseReactionInfo>(promiseInfo->ResolveReactionCount);

                for(uint32 i = 0; i < promiseInfo->ResolveReactionCount; ++i)
                {
                    NSSnapValues::ParsePromiseReactionInfo(promiseInfo->ResolveReactions + i, i != 0, reader, alloc);
                }
            }
            reader->ReadSequenceEnd();

            promiseInfo->RejectReactionCount = reader->ReadLengthValue(true);
            promiseInfo->RejectReactions = nullptr;
            reader->ReadSequenceStart_WDefaultKey(true);
            if(promiseInfo->RejectReactionCount != 0)
            {
                promiseInfo->RejectReactions = alloc.SlabAllocateArray<NSSnapValues::SnapPromiseReactionInfo>(promiseInfo->RejectReactionCount);

                for(uint32 i = 0; i < promiseInfo->RejectReactionCount; ++i)
                {
                    NSSnapValues::ParsePromiseReactionInfo(promiseInfo->RejectReactions + i, i != 0, reader, alloc);
                }
            }
            reader->ReadSequenceEnd();

            SnapObjectSetAddtlInfoAs<SnapPromiseInfo*, SnapObjectType::SnapPromiseObject>(snpObject, promiseInfo);
        }